

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

TranslationBlock *
tb_htable_lookup_x86_64
          (CPUState *cpu,target_ulong pc,target_ulong cs_base,uint32_t flags,uint32_t cf_mask)

{
  uc_struct_conflict7 *uc_00;
  uint32_t hash;
  target_ulong tStack_70;
  uint32_t h;
  tb_desc desc;
  tb_page_addr_t phys_pc;
  uc_struct_conflict *uc;
  uint32_t cf_mask_local;
  uint32_t flags_local;
  target_ulong cs_base_local;
  target_ulong pc_local;
  CPUState *cpu_local;
  
  uc_00 = cpu->uc;
  desc.cs_base = (target_ulong)cpu->env_ptr;
  desc.flags = (uint32_t)cpu->trace_dstate[0];
  tStack_70 = pc;
  desc.pc = cs_base;
  desc.phys_page1._0_4_ = flags;
  desc.phys_page1._4_4_ = cf_mask;
  desc._40_8_ = get_page_addr_code_x86_64((CPUArchState *)desc.cs_base,pc);
  if (desc._40_8_ == 0xffffffffffffffff) {
    cpu_local = (CPUState *)0x0;
  }
  else {
    desc.env = (CPUArchState *)(desc._40_8_ & 0xfffffffffffff000);
    hash = tb_hash_func(desc._40_8_,pc,flags,cf_mask,(uint32_t)cpu->trace_dstate[0]);
    cpu_local = (CPUState *)
                qht_lookup_custom((uc_struct_conflict5 *)uc_00,
                                  (qht *)(cpu->uc->tcg_ctx->gen_insn_data[0x155] + 1),
                                  &stack0xffffffffffffff90,hash,tb_lookup_cmp);
  }
  return (TranslationBlock *)cpu_local;
}

Assistant:

TranslationBlock *tb_htable_lookup(CPUState *cpu, target_ulong pc,
                                   target_ulong cs_base, uint32_t flags,
                                   uint32_t cf_mask)
{
    struct uc_struct *uc = cpu->uc;
    tb_page_addr_t phys_pc;
    struct tb_desc desc;
    uint32_t h;

    desc.env = (CPUArchState *)cpu->env_ptr;
    desc.cs_base = cs_base;
    desc.flags = flags;
    desc.cf_mask = cf_mask;
    desc.trace_vcpu_dstate = *cpu->trace_dstate;
    desc.pc = pc;
    phys_pc = get_page_addr_code(desc.env, pc);
    if (phys_pc == -1) {
        return NULL;
    }
    desc.phys_page1 = phys_pc & TARGET_PAGE_MASK;
    h = tb_hash_func(phys_pc, pc, flags, cf_mask, *cpu->trace_dstate);
    return qht_lookup_custom(uc, &cpu->uc->tcg_ctx->tb_ctx.htable, &desc, h, tb_lookup_cmp);
}